

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int parse_http_headers(char **buf,mg_header *hdr)

{
  bool bVar1;
  char *local_30;
  char *dp;
  int num_headers;
  int i;
  mg_header *hdr_local;
  char **buf_local;
  
  dp._0_4_ = 0;
  dp._4_4_ = 0;
  while( true ) {
    if (0x3f < dp._4_4_) {
      return (int)dp;
    }
    local_30 = *buf;
    while( true ) {
      bVar1 = false;
      if ((*local_30 != ':') && (bVar1 = false, ' ' < *local_30)) {
        bVar1 = *local_30 < '\x7f';
      }
      if (!bVar1) break;
      local_30 = local_30 + 1;
    }
    if (local_30 == *buf) {
      return (int)dp;
    }
    for (; *local_30 == ' '; local_30 = local_30 + 1) {
      *local_30 = '\0';
    }
    if (*local_30 != ':') {
      return -1;
    }
    *local_30 = '\0';
    hdr[dp._4_4_].name = *buf;
    do {
      local_30 = local_30 + 1;
      bVar1 = true;
      if (*local_30 != ' ') {
        bVar1 = *local_30 == '\t';
      }
    } while (bVar1);
    hdr[dp._4_4_].value = local_30;
    while( true ) {
      bVar1 = false;
      if ((*local_30 != '\0') && (bVar1 = false, *local_30 != '\r')) {
        bVar1 = *local_30 != '\n';
      }
      if (!bVar1) break;
      local_30 = local_30 + 1;
    }
    if (*local_30 == '\r') {
      *local_30 = '\0';
      local_30 = local_30 + 1;
      if (*local_30 != '\n') {
        return -1;
      }
    }
    dp._0_4_ = dp._4_4_ + 1;
    if (*local_30 == '\0') break;
    *local_30 = '\0';
    local_30 = local_30 + 1;
    *buf = local_30;
    if (*local_30 == '\r') {
      return (int)dp;
    }
    if (*local_30 == '\n') {
      return (int)dp;
    }
    dp._4_4_ = dp._4_4_ + 1;
  }
  *buf = local_30;
  return (int)dp;
}

Assistant:

static int
parse_http_headers(char **buf, struct mg_header hdr[MG_MAX_HEADERS])
{
	int i;
	int num_headers = 0;

	for (i = 0; i < (int)MG_MAX_HEADERS; i++) {
		char *dp = *buf;

		/* Skip all ASCII characters (>SPACE, <127), to find a ':' */
		while ((*dp != ':') && (*dp >= 33) && (*dp <= 126)) {
			dp++;
		}
		if (dp == *buf) {
			/* End of headers reached. */
			break;
		}

		/* Drop all spaces after header name before : */
		while (*dp == ' ') {
			*dp = 0;
			dp++;
		}
		if (*dp != ':') {
			/* This is not a valid field. */
			return -1;
		}

		/* End of header key (*dp == ':') */
		/* Truncate here and set the key name */
		*dp = 0;
		hdr[i].name = *buf;

		/* Skip all spaces */
		do {
			dp++;
		} while ((*dp == ' ') || (*dp == '\t'));

		/* The rest of the line is the value */
		hdr[i].value = dp;

		/* Find end of line */
		while ((*dp != 0) && (*dp != '\r') && (*dp != '\n')) {
			dp++;
		};

		/* eliminate \r */
		if (*dp == '\r') {
			*dp = 0;
			dp++;
			if (*dp != '\n') {
				/* This is not a valid line. */
				return -1;
			}
		}

		/* here *dp is either 0 or '\n' */
		/* in any case, we have a new header */
		num_headers = i + 1;

		if (*dp) {
			*dp = 0;
			dp++;
			*buf = dp;

			if ((dp[0] == '\r') || (dp[0] == '\n')) {
				/* This is the end of the header */
				break;
			}
		} else {
			*buf = dp;
			break;
		}
	}
	return num_headers;
}